

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zetMetricCreateFromProgrammableExp
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,
          zet_metric_programmable_param_value_exp_t *pParameterValues,uint32_t parameterCount,
          char *pName,char *pDescription,uint32_t *pMetricHandleCount,
          zet_metric_handle_t *phMetricHandles)

{
  object_t<_zet_metric_handle_t_*> *poVar1;
  bool bVar2;
  bad_alloc *anon_var_0;
  ulong local_60;
  size_t i;
  zet_pfnMetricCreateFromProgrammableExp_t pfnCreateFromProgrammableExp;
  dditable_t *dditable;
  uint32_t *puStack_40;
  ze_result_t result;
  uint32_t *pMetricHandleCount_local;
  char *pDescription_local;
  char *pName_local;
  zet_metric_programmable_param_value_exp_t *pzStack_20;
  uint32_t parameterCount_local;
  zet_metric_programmable_param_value_exp_t *pParameterValues_local;
  zet_metric_programmable_exp_handle_t hMetricProgrammable_local;
  
  dditable._4_4_ = 0;
  pfnCreateFromProgrammableExp =
       *(zet_pfnMetricCreateFromProgrammableExp_t *)(hMetricProgrammable + 8);
  if (*(code **)(pfnCreateFromProgrammableExp + 0x738) == (code *)0x0) {
    hMetricProgrammable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    pParameterValues_local = *(zet_metric_programmable_param_value_exp_t **)hMetricProgrammable;
    puStack_40 = pMetricHandleCount;
    pMetricHandleCount_local = (uint32_t *)pDescription;
    pDescription_local = pName;
    pName_local._4_4_ = parameterCount;
    pzStack_20 = pParameterValues;
    dditable._4_4_ =
         (**(code **)(pfnCreateFromProgrammableExp + 0x738))
                   (pParameterValues_local,pParameterValues,parameterCount,pName,pDescription,
                    pMetricHandleCount,phMetricHandles);
    hMetricProgrammable_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      local_60 = 0;
      while( true ) {
        bVar2 = false;
        if (phMetricHandles != (zet_metric_handle_t *)0x0) {
          bVar2 = local_60 < *puStack_40;
        }
        if (!bVar2) break;
        poVar1 = singleton_factory_t<object_t<_zet_metric_handle_t*>,_zet_metric_handle_t*>::
                 getInstance<_zet_metric_handle_t*&,dditable_t*&>
                           ((singleton_factory_t<object_t<_zet_metric_handle_t*>,_zet_metric_handle_t*>
                             *)(context + 0x11a0),phMetricHandles + local_60,
                            (dditable_t **)&pfnCreateFromProgrammableExp);
        phMetricHandles[local_60] = (zet_metric_handle_t)poVar1;
        local_60 = local_60 + 1;
      }
      hMetricProgrammable_local._4_4_ = dditable._4_4_;
    }
  }
  return hMetricProgrammable_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricCreateFromProgrammableExp(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        zet_metric_programmable_param_value_exp_t* pParameterValues,///< [in] list of parameter values to be set.
        uint32_t parameterCount,                        ///< [in] Count of parameters to set.
        const char* pName,                              ///< [in] pointer to metric name to be used. Must point to a
                                                        ///< null-terminated character array no longer than ::ZET_MAX_METRIC_NAME.
        const char* pDescription,                       ///< [in] pointer to metric description to be used. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_DESCRIPTION.
        uint32_t* pMetricHandleCount,                   ///< [in,out] Pointer to the number of metric handles.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< number of metric handles available for this programmable.
                                                        ///< if count is greater than the number of metric handles available, then
                                                        ///< the driver shall update the value with the correct number of metric
                                                        ///< handles available.
        zet_metric_handle_t* phMetricHandles            ///< [in,out][optional][range(0,*pMetricHandleCount)] array of handle of metrics.
                                                        ///< if count is less than the number of metrics available, then driver
                                                        ///< shall only retrieve that number of metric handles.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_metric_programmable_exp_object_t*>( hMetricProgrammable )->dditable;
        auto pfnCreateFromProgrammableExp = dditable->zet.MetricExp.pfnCreateFromProgrammableExp;
        if( nullptr == pfnCreateFromProgrammableExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMetricProgrammable = reinterpret_cast<zet_metric_programmable_exp_object_t*>( hMetricProgrammable )->handle;

        // forward to device-driver
        result = pfnCreateFromProgrammableExp( hMetricProgrammable, pParameterValues, parameterCount, pName, pDescription, pMetricHandleCount, phMetricHandles );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handles to loader handles
            for( size_t i = 0; ( nullptr != phMetricHandles ) && ( i < *pMetricHandleCount ); ++i )
                phMetricHandles[ i ] = reinterpret_cast<zet_metric_handle_t>(
                    context->zet_metric_factory.getInstance( phMetricHandles[ i ], dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }